

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  bool bVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  uchar *puVar7;
  uchar uVar8;
  int iVar9;
  uchar *puVar10;
  char *line_buffer;
  ulong uVar11;
  uchar *__src;
  size_t __n;
  int data_len;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int filter_type;
  int iVar15;
  ushort uVar16;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  int iVar25;
  undefined1 auVar26 [64];
  int zlen;
  ulong local_b0;
  uchar *local_a8;
  int *local_a0;
  ulong local_98;
  long local_90;
  size_t local_88;
  uchar *local_80;
  undefined1 local_78 [64];
  undefined1 auVar17 [16];
  
  iVar5 = stbi_write_force_png_filter;
  uVar13 = n * x;
  if (stride_bytes == 0) {
    stride_bytes = uVar13;
  }
  iVar9 = -1;
  if (stbi_write_force_png_filter < 5) {
    iVar9 = stbi_write_force_png_filter;
  }
  data_len = (uVar13 + 1) * y;
  local_a8 = pixels;
  puVar10 = (uchar *)malloc((long)data_len);
  if (puVar10 != (uchar *)0x0) {
    local_88 = (size_t)(int)uVar13;
    line_buffer = (char *)malloc(local_88);
    if (line_buffer == (char *)0x0) {
      free(puVar10);
    }
    else {
      local_b0 = (ulong)uVar13;
      local_a0 = out_len;
      if (0 < y) {
        local_90 = (long)(int)(uVar13 + 1);
        uVar14 = 0;
        local_98 = (ulong)(uint)y;
        auVar20 = vpbroadcastq_avx512f();
        local_78 = vmovdqu64_avx512f(auVar20);
        do {
          iVar15 = iVar5;
          iVar12 = iVar9;
          if (iVar9 < 0) {
            iVar12 = 0x7fffffff;
            iVar15 = 0;
            filter_type = 0;
            do {
              stbiw__encode_png_line
                        (local_a8,stride_bytes,x,y,(int)uVar14,n,filter_type,line_buffer);
              auVar20 = vmovdqu64_avx512f(local_78);
              auVar21 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar22 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              iVar25 = 0;
              if (0 < (int)local_b0) {
                auVar26 = ZEXT1664((undefined1  [16])0x0);
                uVar11 = 0;
                do {
                  auVar23 = vpbroadcastq_avx512f();
                  auVar24 = vmovdqa64_avx512f(auVar26);
                  auVar26 = vporq_avx512f(auVar23,auVar21);
                  auVar23 = vporq_avx512f(auVar23,auVar22);
                  uVar2 = vpcmpuq_avx512f(auVar23,auVar20,2);
                  bVar3 = (byte)uVar2;
                  uVar2 = vpcmpuq_avx512f(auVar26,auVar20,2);
                  bVar4 = (byte)uVar2;
                  uVar16 = CONCAT11(bVar4,bVar3);
                  auVar17 = vmovdqu8_avx512vl(*(undefined1 (*) [16])(line_buffer + uVar11));
                  auVar18[1] = ((byte)(uVar16 >> 1) & 1) * auVar17[1];
                  auVar18[0] = (bVar3 & 1) * auVar17[0];
                  auVar18[2] = ((byte)(uVar16 >> 2) & 1) * auVar17[2];
                  auVar18[3] = ((byte)(uVar16 >> 3) & 1) * auVar17[3];
                  auVar18[4] = ((byte)(uVar16 >> 4) & 1) * auVar17[4];
                  auVar18[5] = ((byte)(uVar16 >> 5) & 1) * auVar17[5];
                  auVar18[6] = ((byte)(uVar16 >> 6) & 1) * auVar17[6];
                  auVar18[7] = ((byte)(uVar16 >> 7) & 1) * auVar17[7];
                  auVar18[8] = (bVar4 & 1) * auVar17[8];
                  auVar18[9] = (bVar4 >> 1 & 1) * auVar17[9];
                  auVar18[10] = (bVar4 >> 2 & 1) * auVar17[10];
                  auVar18[0xb] = (bVar4 >> 3 & 1) * auVar17[0xb];
                  auVar18[0xc] = (bVar4 >> 4 & 1) * auVar17[0xc];
                  auVar18[0xd] = (bVar4 >> 5 & 1) * auVar17[0xd];
                  auVar18[0xe] = (bVar4 >> 6 & 1) * auVar17[0xe];
                  auVar18[0xf] = -((char)bVar4 >> 7) * auVar17[0xf];
                  uVar11 = uVar11 + 0x10;
                  auVar17 = vpabsb_avx(auVar18);
                  auVar26 = vpmovzxbd_avx512f(auVar17);
                  auVar26 = vpaddd_avx512f(auVar24,auVar26);
                } while ((uVar13 + 0xf & 0xfffffff0) != uVar11);
                auVar20 = vmovdqa32_avx512f(auVar26);
                auVar21._0_4_ =
                     (uint)(bVar3 & 1) * auVar20._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar24._0_4_;
                bVar1 = (bool)((byte)(uVar16 >> 1) & 1);
                auVar21._4_4_ = (uint)bVar1 * auVar20._4_4_ | (uint)!bVar1 * auVar24._4_4_;
                bVar1 = (bool)((byte)(uVar16 >> 2) & 1);
                auVar21._8_4_ = (uint)bVar1 * auVar20._8_4_ | (uint)!bVar1 * auVar24._8_4_;
                bVar1 = (bool)((byte)(uVar16 >> 3) & 1);
                auVar21._12_4_ = (uint)bVar1 * auVar20._12_4_ | (uint)!bVar1 * auVar24._12_4_;
                bVar1 = (bool)((byte)(uVar16 >> 4) & 1);
                auVar21._16_4_ = (uint)bVar1 * auVar20._16_4_ | (uint)!bVar1 * auVar24._16_4_;
                bVar1 = (bool)((byte)(uVar16 >> 5) & 1);
                auVar21._20_4_ = (uint)bVar1 * auVar20._20_4_ | (uint)!bVar1 * auVar24._20_4_;
                bVar1 = (bool)((byte)(uVar16 >> 6) & 1);
                auVar21._24_4_ = (uint)bVar1 * auVar20._24_4_ | (uint)!bVar1 * auVar24._24_4_;
                bVar1 = (bool)((byte)(uVar16 >> 7) & 1);
                auVar21._28_4_ = (uint)bVar1 * auVar20._28_4_ | (uint)!bVar1 * auVar24._28_4_;
                auVar21._32_4_ =
                     (uint)(bVar4 & 1) * auVar20._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar24._32_4_;
                bVar1 = (bool)(bVar4 >> 1 & 1);
                auVar21._36_4_ = (uint)bVar1 * auVar20._36_4_ | (uint)!bVar1 * auVar24._36_4_;
                bVar1 = (bool)(bVar4 >> 2 & 1);
                auVar21._40_4_ = (uint)bVar1 * auVar20._40_4_ | (uint)!bVar1 * auVar24._40_4_;
                bVar1 = (bool)(bVar4 >> 3 & 1);
                auVar21._44_4_ = (uint)bVar1 * auVar20._44_4_ | (uint)!bVar1 * auVar24._44_4_;
                bVar1 = (bool)(bVar4 >> 4 & 1);
                auVar21._48_4_ = (uint)bVar1 * auVar20._48_4_ | (uint)!bVar1 * auVar24._48_4_;
                bVar1 = (bool)(bVar4 >> 5 & 1);
                auVar21._52_4_ = (uint)bVar1 * auVar20._52_4_ | (uint)!bVar1 * auVar24._52_4_;
                bVar1 = (bool)(bVar4 >> 6 & 1);
                auVar21._56_4_ = (uint)bVar1 * auVar20._56_4_ | (uint)!bVar1 * auVar24._56_4_;
                auVar21._60_4_ =
                     (uint)(bVar4 >> 7) * auVar20._60_4_ |
                     (uint)!(bool)(bVar4 >> 7) * auVar24._60_4_;
                auVar19 = vextracti64x4_avx512f(auVar21,1);
                auVar20 = vpaddd_avx512f(auVar21,ZEXT3264(auVar19));
                auVar17 = vpaddd_avx(auVar20._0_16_,auVar20._16_16_);
                auVar18 = vpshufd_avx(auVar17,0xee);
                auVar17 = vpaddd_avx(auVar17,auVar18);
                auVar18 = vpshufd_avx(auVar17,0x55);
                auVar17 = vpaddd_avx(auVar17,auVar18);
                iVar25 = auVar17._0_4_;
              }
              if (iVar25 < iVar12) {
                iVar12 = iVar25;
                iVar15 = filter_type;
              }
              filter_type = filter_type + 1;
            } while (filter_type != 5);
            uVar8 = '\x05';
            iVar12 = iVar15;
            if (iVar15 != 5) goto LAB_001628f5;
          }
          else {
LAB_001628f5:
            stbiw__encode_png_line(local_a8,stride_bytes,x,y,(int)uVar14,n,iVar12,line_buffer);
            uVar8 = (uchar)iVar15;
          }
          puVar10[uVar14 * local_90] = uVar8;
          memcpy(puVar10 + uVar14 * local_90 + 1,line_buffer,local_88);
          uVar14 = uVar14 + 1;
        } while (uVar14 != local_98);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar10,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar10);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar10 = (uchar *)malloc(__n + 0x39);
        piVar6 = local_a0;
        if (puVar10 != (uchar *)0x0) {
          *local_a0 = (int)(__n + 0x39);
          puVar10[0] = 0x89;
          puVar10[1] = 'P';
          puVar10[2] = 'N';
          puVar10[3] = 'G';
          puVar10[4] = '\r';
          puVar10[5] = '\n';
          puVar10[6] = '\x1a';
          puVar10[7] = '\n';
          puVar10[8] = '\0';
          puVar10[9] = '\0';
          puVar10[10] = '\0';
          puVar10[0xb] = '\r';
          puVar10[0xc] = 'I';
          puVar10[0xd] = 'H';
          puVar10[0xe] = 'D';
          puVar10[0xf] = 'R';
          puVar10[0x10] = (uchar)((uint)x >> 0x18);
          puVar10[0x11] = (uchar)((uint)x >> 0x10);
          puVar10[0x12] = (uchar)((uint)x >> 8);
          puVar10[0x13] = (uchar)x;
          puVar10[0x14] = (uchar)((uint)y >> 0x18);
          puVar10[0x15] = (uchar)((uint)y >> 0x10);
          puVar10[0x16] = (uchar)((uint)y >> 8);
          puVar10[0x17] = (uchar)y;
          puVar10[0x18] = '\b';
          local_80 = puVar10 + 0x1d;
          puVar10[0x19] = (&DAT_001c71c0)[(long)n * 4];
          puVar10[0x1a] = '\0';
          puVar10[0x1b] = '\0';
          puVar10[0x1c] = '\0';
          stbiw__wpcrc(&local_80,0xd);
          puVar7 = local_80;
          *local_80 = (uchar)((uint)zlen >> 0x18);
          local_80[1] = (uchar)((uint)zlen >> 0x10);
          local_80[2] = (uchar)((uint)zlen >> 8);
          local_80[3] = (uchar)zlen;
          local_80[4] = 'I';
          local_80[5] = 'D';
          local_80[6] = 'A';
          local_80[7] = 'T';
          memmove(local_80 + 8,__src,__n);
          local_80 = puVar7 + __n + 8;
          free(__src);
          stbiw__wpcrc(&local_80,zlen);
          local_80[0] = '\0';
          local_80[1] = '\0';
          local_80[2] = '\0';
          local_80[3] = '\0';
          local_80[4] = 'I';
          local_80[5] = 'E';
          local_80[6] = 'N';
          local_80[7] = 'D';
          local_80 = local_80 + 8;
          stbiw__wpcrc(&local_80,0);
          if (local_80 == puVar10 + *piVar6) {
            return puVar10;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image_write.h"
                        ,0x483,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}